

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntConstantBounds.h
# Opt level: O0

IntConstantBounds __thiscall IntConstantBounds::And_0x1f(IntConstantBounds *this)

{
  int32 mask;
  IntConstantBounds *this_local;
  
  if (((ulong)((long)this->upperBound - (long)this->lowerBound) < 0x1f) &&
     ((this->lowerBound & 0x1fU) <= (this->upperBound & 0x1fU))) {
    IntConstantBounds((IntConstantBounds *)&this_local,this->lowerBound & 0x1f,
                      this->upperBound & 0x1f);
  }
  else {
    IntConstantBounds((IntConstantBounds *)&this_local,0,0x1f);
  }
  return (IntConstantBounds)this_local;
}

Assistant:

IntConstantBounds And_0x1f() const
    {
        const int32 mask = 0x1f;
        if(static_cast<UIntConstType>(upperBound) - static_cast<UIntConstType>(lowerBound) >= static_cast<UIntConstType>(mask) ||
            (lowerBound & mask) > (upperBound & mask))
        {
            // The range contains all items in the set {0-mask}, or the range crosses a boundary of {0-mask}. Since we cannot
            // represent ranges like {0-5,8-mask}, just use {0-mask}.
            return IntConstantBounds(0, mask);
        }
        return IntConstantBounds(lowerBound & mask, upperBound & mask);
    }